

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O0

void fdjac2(custom_funcmult *funcmult,double *x,int M,int N,double *fvec,double *fjac,int ldfjac,
           double epsfcn,double eps)

{
  double dVar1;
  double *__ptr;
  double dVar2;
  double *wa;
  double zero;
  double temp;
  double h;
  double epsmch;
  int j;
  int i;
  double eps_local;
  double epsfcn_local;
  double *fjac_local;
  double *fvec_local;
  int N_local;
  int M_local;
  double *x_local;
  custom_funcmult *funcmult_local;
  
  dVar2 = pmax(epsfcn,eps);
  dVar2 = sqrt(dVar2);
  __ptr = (double *)malloc((long)M << 3);
  for (epsmch._0_4_ = 0; epsmch._0_4_ < N; epsmch._0_4_ = epsmch._0_4_ + 1) {
    dVar1 = x[epsmch._0_4_];
    temp = dVar2 * ABS(dVar1);
    if ((temp == 0.0) && (!NAN(temp))) {
      temp = dVar2;
    }
    x[epsmch._0_4_] = dVar1 + temp;
    (*funcmult->funcmult)(x,M,N,__ptr,funcmult->params);
    x[epsmch._0_4_] = dVar1;
    for (epsmch._4_4_ = 0; epsmch._4_4_ < M; epsmch._4_4_ = epsmch._4_4_ + 1) {
      fjac[epsmch._4_4_ * N + epsmch._0_4_] = (__ptr[epsmch._4_4_] - fvec[epsmch._4_4_]) / temp;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void fdjac2(custom_funcmult *funcmult, double *x, int M, int N, double *fvec, double *fjac, int ldfjac,
		double epsfcn,double eps) {
	int i,j;
	double epsmch,h,temp,zero;
	double *wa;

	zero = 0.0;
	epsmch = eps;
	eps = sqrt(pmax(epsfcn,epsmch));

	wa = (double*) malloc(sizeof(double) *M);

	for(j = 0; j < N;++j) {
        temp = x[j];
        h = eps*fabs(temp);
        if (h == zero) {
        	h = eps;
        }
        x[j] = temp + h;
        FUNCMULT_EVAL(funcmult,x,M,N,wa);
        x[j] = temp;
        for(i = 0; i < M;++i) {
        	fjac[i*N+j] = (wa[i] - fvec[i])/h;
        }
	}

	free(wa);

}